

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_parse_flow_mapping_key(yaml_parser_t *parser,yaml_event_t *event,int first)

{
  yaml_parser_state_t *pyVar1;
  int iVar2;
  yaml_mark_t *pyVar3;
  yaml_token_t *local_50;
  yaml_token_t *local_48;
  yaml_token_t *local_40;
  yaml_token_t *local_38;
  yaml_token_t *local_30;
  yaml_token_t *token;
  int first_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  if (first != 0) {
    if ((parser->token_available == 0) &&
       (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
      local_38 = (yaml_token_t *)0x0;
    }
    else {
      local_38 = (parser->tokens).head;
    }
    if (((parser->marks).top == (parser->marks).end) &&
       (iVar2 = yaml_stack_extend(&(parser->marks).start,&(parser->marks).top,&(parser->marks).end),
       iVar2 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar3 = (parser->marks).top;
    (parser->marks).top = pyVar3 + 1;
    pyVar3->index = (local_38->start_mark).index;
    pyVar3->line = (local_38->start_mark).line;
    pyVar3->column = (local_38->start_mark).column;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
  }
  if ((parser->token_available == 0) && (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0))
  {
    local_40 = (yaml_token_t *)0x0;
  }
  else {
    local_40 = (parser->tokens).head;
  }
  local_30 = local_40;
  if (local_40 != (yaml_token_t *)0x0) {
    if (local_40->type != YAML_FLOW_MAPPING_END_TOKEN) {
      if (first == 0) {
        if (local_40->type != YAML_FLOW_ENTRY_TOKEN) {
          pyVar3 = (parser->marks).top + -1;
          (parser->marks).top = pyVar3;
          iVar2 = yaml_parser_set_parser_error_context
                            (parser,"while parsing a flow mapping",*pyVar3,
                             "did not find expected \',\' or \'}\'",local_40->start_mark);
          return iVar2;
        }
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN)
        ;
        (parser->tokens).head = (parser->tokens).head + 1;
        if ((parser->token_available == 0) &&
           (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
          local_48 = (yaml_token_t *)0x0;
        }
        else {
          local_48 = (parser->tokens).head;
        }
        local_30 = local_48;
        if (local_48 == (yaml_token_t *)0x0) {
          return 0;
        }
      }
      if (local_30->type == YAML_KEY_TOKEN) {
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN)
        ;
        (parser->tokens).head = (parser->tokens).head + 1;
        if ((parser->token_available == 0) &&
           (iVar2 = yaml_parser_fetch_more_tokens(parser), iVar2 == 0)) {
          local_50 = (yaml_token_t *)0x0;
        }
        else {
          local_50 = (parser->tokens).head;
        }
        if (local_50 != (yaml_token_t *)0x0) {
          if (((local_50->type != YAML_VALUE_TOKEN) && (local_50->type != YAML_FLOW_ENTRY_TOKEN)) &&
             (local_50->type != YAML_FLOW_MAPPING_END_TOKEN)) {
            if (((parser->states).top == (parser->states).end) &&
               (iVar2 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                          &(parser->states).end), iVar2 == 0)) {
              parser->error = YAML_MEMORY_ERROR;
              return 0;
            }
            pyVar1 = (parser->states).top;
            (parser->states).top = pyVar1 + 1;
            *pyVar1 = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
            iVar2 = yaml_parser_parse_node(parser,event,0,0);
            return iVar2;
          }
          parser->state = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
          iVar2 = yaml_parser_process_empty_scalar(parser,event,local_50->start_mark);
          return iVar2;
        }
        return 0;
      }
      if (local_30->type != YAML_FLOW_MAPPING_END_TOKEN) {
        if (((parser->states).top == (parser->states).end) &&
           (iVar2 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                      &(parser->states).end), iVar2 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar1 = (parser->states).top;
        (parser->states).top = pyVar1 + 1;
        *pyVar1 = YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE;
        iVar2 = yaml_parser_parse_node(parser,event,0,0);
        return iVar2;
      }
    }
    pyVar1 = (parser->states).top;
    (parser->states).top = pyVar1 + -1;
    parser->state = pyVar1[-1];
    (parser->marks).top = (parser->marks).top + -1;
    memset(event,0,0x68);
    event->type = YAML_MAPPING_END_EVENT;
    (event->start_mark).index = (local_30->start_mark).index;
    (event->start_mark).line = (local_30->start_mark).line;
    (event->start_mark).column = (local_30->start_mark).column;
    (event->end_mark).index = (local_30->end_mark).index;
    (event->end_mark).line = (local_30->end_mark).line;
    (event->end_mark).column = (local_30->end_mark).column;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    parser->stream_end_produced = (uint)(((parser->tokens).head)->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = (parser->tokens).head + 1;
    return 1;
  }
  return 0;
}

Assistant:

static int
yaml_parser_parse_flow_mapping_key(yaml_parser_t *parser,
        yaml_event_t *event, int first)
{
    yaml_token_t *token;

    if (first) {
        token = PEEK_TOKEN(parser);
        if (!PUSH(parser, parser->marks, token->start_mark))
            return 0;
        SKIP_TOKEN(parser);
    }

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type != YAML_FLOW_MAPPING_END_TOKEN)
    {
        if (!first) {
            if (token->type == YAML_FLOW_ENTRY_TOKEN) {
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) return 0;
            }
            else {
                return yaml_parser_set_parser_error_context(parser,
                        "while parsing a flow mapping", POP(parser, parser->marks),
                        "did not find expected ',' or '}'", token->start_mark);
            }
        }

        if (token->type == YAML_KEY_TOKEN) {
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) return 0;
            if (token->type != YAML_VALUE_TOKEN
                    && token->type != YAML_FLOW_ENTRY_TOKEN
                    && token->type != YAML_FLOW_MAPPING_END_TOKEN) {
                if (!PUSH(parser, parser->states,
                            YAML_PARSE_FLOW_MAPPING_VALUE_STATE))
                    return 0;
                return yaml_parser_parse_node(parser, event, 0, 0);
            }
            else {
                parser->state = YAML_PARSE_FLOW_MAPPING_VALUE_STATE;
                return yaml_parser_process_empty_scalar(parser, event,
                        token->start_mark);
            }
        }
        else if (token->type != YAML_FLOW_MAPPING_END_TOKEN) {
            if (!PUSH(parser, parser->states,
                        YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE))
                return 0;
            return yaml_parser_parse_node(parser, event, 0, 0);
        }
    }

    parser->state = POP(parser, parser->states);
    (void)POP(parser, parser->marks);
    MAPPING_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
    SKIP_TOKEN(parser);
    return 1;
}